

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

pair<jbcoin::PublicKey,_jbcoin::SecretKey> *
jbcoin::randomKeyPair
          (pair<jbcoin::PublicKey,_jbcoin::SecretKey> *__return_storage_ptr__,KeyType type)

{
  PublicKey local_68;
  undefined1 local_34 [8];
  SecretKey sk;
  KeyType type_local;
  
  sk.buf_._24_4_ = type;
  unique0x10000080 = __return_storage_ptr__;
  randomSecretKey();
  derivePublicKey(&local_68,sk.buf_._24_4_,(SecretKey *)local_34);
  std::pair<jbcoin::PublicKey,_jbcoin::SecretKey>::pair<jbcoin::PublicKey,_true>
            (__return_storage_ptr__,&local_68,(SecretKey *)local_34);
  SecretKey::~SecretKey((SecretKey *)local_34);
  return __return_storage_ptr__;
}

Assistant:

std::pair<PublicKey, SecretKey>
randomKeyPair (KeyType type)
{
    auto const sk = randomSecretKey();
    return { derivePublicKey(type, sk), sk };
}